

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O0

int Kf_SetRemoveDuplicatesSimple(Kf_Set_t *p,Kf_Cut_t *pCutNew)

{
  int iVar1;
  Kf_Cut_t *local_28;
  Kf_Cut_t *pCut;
  Kf_Cut_t *pCutNew_local;
  Kf_Set_t *p_local;
  
  local_28 = Kf_SetCut(p,p->pList[pCutNew->nLeaves]);
  while( true ) {
    if (local_28 == (Kf_Cut_t *)0x0) {
      return 0;
    }
    if ((local_28->Sign == pCutNew->Sign) &&
       (iVar1 = Kf_SetCutIsContainedSimple(local_28,pCutNew), iVar1 != 0)) break;
    local_28 = Kf_SetCut(p,local_28->iNext);
  }
  return 1;
}

Assistant:

static inline int Kf_SetRemoveDuplicatesSimple( Kf_Set_t * p, Kf_Cut_t * pCutNew )
{
    Kf_Cut_t * pCut;
    Kf_ListForEachCut( p, pCutNew->nLeaves, pCut )
        if ( pCut->Sign == pCutNew->Sign && Kf_SetCutIsContainedSimple(pCut, pCutNew) )
            return 1;
    return 0;
}